

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

void upb_Message_SetBaseFieldInt32(upb_Message *msg,upb_MiniTableField *f,int32_t value)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  
  bVar2 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  uVar5 = (ulong)bVar2;
  bVar3 = f->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar3 & 0x10) == 0) {
    uVar6 = uVar5 - 1;
  }
  else {
    uVar6 = 0xd;
    if (uVar5 != 5) {
      if (bVar2 != 0xc) goto LAB_0017e276;
      uVar6 = 8;
    }
  }
  if ((0x14010UL >> (uVar6 & 0x3f) & 1) == 0) {
    if ((bVar3 & 0x10) == 0) {
      if (bVar2 != 0xe) {
LAB_0017e257:
        __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x273,
                      "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                     );
      }
    }
    else if (uVar5 != 5) {
      if (bVar2 != 0xc) {
LAB_0017e276:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      goto LAB_0017e257;
    }
  }
  if ((bVar3 & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x274,
                  "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  if ((bVar3 & 0xc0) != 0x40) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x275,
                  "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x13b,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  if ((bVar3 & 8) != 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x13c,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  uVar4 = f->presence;
  if ((short)uVar4 < 1) {
    if ((short)uVar4 < 0) {
      *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar4 ^ 0xffff)) =
           f->number_dont_copy_me__upb_internal_use_only;
    }
    (*(code *)(&DAT_003a11d4 +
              *(int *)(&DAT_003a11d4 + (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4
                      )))
              (msg,&DAT_003a11d4,CONCAT44(in_register_00000014,value),
               &DAT_003a11d4 +
               *(int *)(&DAT_003a11d4 +
                       (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4));
    return;
  }
  pbVar1 = (byte *)((long)&msg->field_0 + (ulong)(uVar4 >> 3));
  *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar4 & 7);
  (*(code *)(&DAT_003a11d4 +
            *(int *)(&DAT_003a11d4 + (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6) * 4))
  )();
  return;
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt32(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int32_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);
  upb_Message_SetBaseField(msg, f, &value);
}